

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O1

void __thiscall
argparse::ArgumentParser::ArgumentParser(ArgumentParser *this,string *aProgramName,string *aVersion)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Rb_tree_header *p_Var2;
  pointer pcVar3;
  undefined8 uVar4;
  Argument *pAVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  paVar6 = &(this->mProgramName).field_2;
  (this->mProgramName)._M_dataplus._M_p = (pointer)paVar6;
  pcVar3 = (aProgramName->_M_dataplus)._M_p;
  paVar1 = &aProgramName->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar1) {
    uVar4 = *(undefined8 *)((long)&aProgramName->field_2 + 8);
    paVar6->_M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->mProgramName).field_2 + 8) = uVar4;
  }
  else {
    (this->mProgramName)._M_dataplus._M_p = pcVar3;
    (this->mProgramName).field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  (this->mProgramName)._M_string_length = aProgramName->_M_string_length;
  (aProgramName->_M_dataplus)._M_p = (pointer)paVar1;
  aProgramName->_M_string_length = 0;
  (aProgramName->field_2)._M_local_buf[0] = '\0';
  paVar1 = &(this->mVersion).field_2;
  (this->mVersion)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (aVersion->_M_dataplus)._M_p;
  paVar6 = &aVersion->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar6) {
    uVar4 = *(undefined8 *)((long)&aVersion->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar6->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->mVersion).field_2 + 8) = uVar4;
  }
  else {
    (this->mVersion)._M_dataplus._M_p = pcVar3;
    (this->mVersion).field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
  }
  (this->mVersion)._M_string_length = aVersion->_M_string_length;
  (aVersion->_M_dataplus)._M_p = (pointer)paVar6;
  aVersion->_M_string_length = 0;
  (aVersion->field_2)._M_local_buf[0] = '\0';
  (this->mDescription)._M_dataplus._M_p = (pointer)&(this->mDescription).field_2;
  (this->mDescription)._M_string_length = 0;
  (this->mDescription).field_2._M_local_buf[0] = '\0';
  (this->mEpilog)._M_dataplus._M_p = (pointer)&(this->mEpilog).field_2;
  (this->mEpilog)._M_string_length = 0;
  (this->mEpilog).field_2._M_local_buf[0] = '\0';
  (this->mPositionalArguments).
  super__List_base<argparse::Argument,_std::allocator<argparse::Argument>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&this->mPositionalArguments;
  (this->mPositionalArguments).
  super__List_base<argparse::Argument,_std::allocator<argparse::Argument>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&this->mPositionalArguments;
  (this->mPositionalArguments).
  super__List_base<argparse::Argument,_std::allocator<argparse::Argument>_>._M_impl._M_node._M_size
       = 0;
  (this->mOptionalArguments).
  super__List_base<argparse::Argument,_std::allocator<argparse::Argument>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&this->mOptionalArguments;
  (this->mOptionalArguments).
  super__List_base<argparse::Argument,_std::allocator<argparse::Argument>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&this->mOptionalArguments;
  (this->mOptionalArguments).
  super__List_base<argparse::Argument,_std::allocator<argparse::Argument>_>._M_impl._M_node._M_size
       = 0;
  p_Var2 = &(this->mArgumentMap)._M_t._M_impl.super__Rb_tree_header;
  (this->mArgumentMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mArgumentMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mArgumentMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->mArgumentMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->mArgumentMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pAVar5 = add_argument<char_const*,char_const*>(this,"-h","--help");
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,"shows help message and exits","");
  std::__cxx11::string::operator=((string *)&pAVar5->mHelp,(string *)local_50);
  pAVar5->mNumArgs = 0;
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  pAVar5 = add_argument<char_const*,char_const*>(this,"-v","--version");
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_70,"prints version information and exits","");
  std::__cxx11::string::operator=((string *)&pAVar5->mHelp,(string *)local_70);
  pAVar5->mNumArgs = 0;
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  return;
}

Assistant:

explicit ArgumentParser(std::string aProgramName = {}, std::string aVersion = "1.0")
      : mProgramName(std::move(aProgramName)), mVersion(std::move(aVersion)) {
    add_argument("-h", "--help")
        .help("shows help message and exits")
        .nargs(0);
    add_argument("-v", "--version")
        .help("prints version information and exits")
        .nargs(0);
  }